

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_code.hpp
# Opt level: O1

string_ref * __thiscall system_error2::_generic_code_domain::name(_generic_code_domain *this)

{
  string_ref *in_RDI;
  
  in_RDI->_begin = "generic domain";
  in_RDI->_end = "";
  in_RDI->_state[0] = (void *)0x0;
  in_RDI->_state[1] = (void *)0x0;
  in_RDI->_state[2] = (void *)0x0;
  in_RDI->_thunk = status_code_domain::string_ref::_checking_string_thunk;
  return in_RDI;
}

Assistant:

virtual _base::string_ref name() const noexcept override { return string_ref("generic domain"); }